

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O1

string_view __thiscall
chain::str::trim_left_view<(chain::str::case_t)0>
          (str *this,string_view data,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *to_remove)

{
  char *pcVar1;
  char *pcVar2;
  ulong *puVar3;
  ulong *puVar4;
  str *psVar5;
  char *pcVar6;
  str *psVar7;
  bool bVar8;
  ulong *puVar9;
  bool bVar10;
  string_view sVar11;
  
  pcVar6 = (char *)data._M_len;
  if (this != (str *)0x0) {
    puVar3 = *(ulong **)data._M_str;
    puVar4 = *(ulong **)((long)data._M_str + 8);
    if (puVar3 != puVar4) {
      puVar9 = puVar3;
      bVar10 = false;
      do {
        bVar8 = bVar10;
        psVar5 = (str *)*puVar9;
        if (psVar5 <= this) {
          do {
            bVar10 = psVar5 == (str *)0x0;
            if (psVar5 != (str *)0x0) {
              if (*(char *)puVar9[1] != *pcVar6) break;
              psVar7 = (str *)0x1;
              while (bVar10 = psVar5 == psVar7, !bVar10) {
                pcVar1 = (char *)puVar9[1] + (long)psVar7;
                pcVar2 = pcVar6 + (long)psVar7;
                psVar7 = psVar7 + 1;
                if (*pcVar1 != *pcVar2) goto LAB_001c559a;
              }
            }
            if (!bVar10) break;
            pcVar6 = pcVar6 + (long)psVar5;
            this = this + -(long)psVar5;
            bVar8 = true;
          } while (psVar5 <= this);
        }
LAB_001c559a:
        puVar9 = puVar9 + 2;
        bVar10 = bVar8;
      } while ((puVar9 != puVar4) || (puVar9 = puVar3, bVar10 = false, bVar8));
    }
  }
  sVar11._M_str = pcVar6;
  sVar11._M_len = (size_t)this;
  return sVar11;
}

Assistant:

auto trim_left_view(std::string_view data, const std::vector<std::string_view>& to_remove) -> std::string_view
{
    if (!data.empty() && !to_remove.empty())
    {
        while (true)
        {
            bool had_removal{false};

            for (const auto& remove : to_remove)
            {
                while (starts_with<case_type>(data, remove))
                {
                    data.remove_prefix(remove.size());
                    had_removal = true;
                }
            }

            if (!had_removal)
            {
                break;
            }
        }
    }

    return data;
}